

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

void __thiscall
leveldb::FindFileTest::Add
          (FindFileTest *this,char *smallest,char *largest,SequenceNumber smallest_seq,
          SequenceNumber largest_seq)

{
  FileMetaData *this_00;
  size_type sVar1;
  Slice local_98;
  InternalKey local_88;
  Slice local_68;
  InternalKey local_58;
  FileMetaData *local_38;
  FileMetaData *f;
  SequenceNumber largest_seq_local;
  SequenceNumber smallest_seq_local;
  char *largest_local;
  char *smallest_local;
  FindFileTest *this_local;
  
  f = (FileMetaData *)largest_seq;
  largest_seq_local = smallest_seq;
  smallest_seq_local = (SequenceNumber)largest;
  largest_local = smallest;
  smallest_local = (char *)this;
  this_00 = (FileMetaData *)operator_new(0x58);
  FileMetaData::FileMetaData(this_00);
  local_38 = this_00;
  sVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (&this->files_);
  local_38->number = sVar1 + 1;
  Slice::Slice(&local_68,largest_local);
  InternalKey::InternalKey(&local_58,&local_68,largest_seq_local,kTypeValue);
  InternalKey::operator=(&local_38->smallest,&local_58);
  InternalKey::~InternalKey(&local_58);
  Slice::Slice(&local_98,(char *)smallest_seq_local);
  InternalKey::InternalKey(&local_88,&local_98,(SequenceNumber)f,kTypeValue);
  InternalKey::operator=(&local_38->largest,&local_88);
  InternalKey::~InternalKey(&local_88);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
            (&this->files_,&local_38);
  return;
}

Assistant:

void Add(const char* smallest, const char* largest,
           SequenceNumber smallest_seq = 100,
           SequenceNumber largest_seq = 100) {
    FileMetaData* f = new FileMetaData;
    f->number = files_.size() + 1;
    f->smallest = InternalKey(smallest, smallest_seq, kTypeValue);
    f->largest = InternalKey(largest, largest_seq, kTypeValue);
    files_.push_back(f);
  }